

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferSource.hpp
# Opt level: O2

void __thiscall
Outputs::Speaker::SampleSource<GI::AY38910::AY38910<false>,_false,_4>::
apply_samples<(Outputs::Speaker::Action)1>
          (SampleSource<GI::AY38910::AY38910<false>,_false,_4> *this,size_t number_of_samples,
          type *target)

{
  AY38910SampleSource<false> *this_00;
  type tVar1;
  ulong uVar2;
  int iVar3;
  short *begin;
  ulong uVar4;
  
  this_00 = (AY38910SampleSource<false> *)(this + -0x454);
  tVar1 = GI::AY38910::AY38910SampleSource<false>::level(this_00);
  iVar3 = this->master_divider_;
  begin = target;
  for (uVar2 = 0;
      (uVar4 = number_of_samples - uVar2, uVar2 <= number_of_samples && uVar4 != 0 &&
      (iVar3 + (int)uVar2 != 4)); uVar2 = uVar2 + 1) {
    *begin = *begin + tVar1;
    this->master_divider_ = iVar3 + (int)uVar2 + 1;
    begin = begin + 1;
  }
  GI::AY38910::AY38910SampleSource<false>::advance(this_00);
  uVar2 = uVar4 >> 2;
  while( true ) {
    iVar3 = (int)uVar2;
    uVar2 = (ulong)(iVar3 - 1);
    if (iVar3 == 0) break;
    tVar1 = GI::AY38910::AY38910SampleSource<false>::level(this_00);
    fill<(Outputs::Speaker::Action)1,short*,short>(begin,begin + 4,tVar1);
    GI::AY38910::AY38910SampleSource<false>::advance(this_00);
    uVar4 = (ulong)((int)uVar4 - 4);
    begin = begin + 4;
  }
  GI::AY38910::AY38910SampleSource<false>::level(this_00);
  this->master_divider_ = (int)uVar4;
  tVar1 = GI::AY38910::AY38910SampleSource<false>::level(this_00);
  fill<(Outputs::Speaker::Action)1,short*,short>(begin,target + number_of_samples,tVar1);
  return;
}

Assistant:

void apply_samples(std::size_t number_of_samples, typename SampleT<stereo>::type *target) {
			auto &source = *static_cast<SourceT *>(this);

			if constexpr (divider == 1) {
				while(number_of_samples--) {
					apply<action>(*target, source.level());
					++target;
					source.advance();
				}
			} else {
				std::size_t c = 0;

				// Fill in the tail of any partially-captured level.
				auto level = source.level();
				while(c < number_of_samples && master_divider_ != divider) {
					apply<action>(target[c], level);
					++c;
					++master_divider_;
				}
				source.advance();

				// Provide all full levels.
				auto whole_steps = static_cast<int>((number_of_samples - c) / divider);
				while(whole_steps--) {
					fill<action>(&target[c], &target[c + divider], source.level());
					c += divider;
					source.advance();
				}

				// Provide the head of a further partial capture.
				level = source.level();
				master_divider_ = static_cast<int>(number_of_samples - c);
				fill<action>(&target[c], &target[number_of_samples], source.level());
			}
		}